

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

string * Path::basedir(string *__return_storage_ptr__,string *path)

{
  bool bVar1;
  size_t sVar2;
  allocator *paVar3;
  char *pcVar4;
  allocator local_12;
  allocator local_11;
  
  if (path->_M_string_length == 0) {
    pcVar4 = "";
    paVar3 = &local_11;
LAB_00175ff3:
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,paVar3);
  }
  else {
    bVar1 = is_root_path(path);
    if (bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
      return __return_storage_ptr__;
    }
    sVar2 = find_last_slash(path);
    if (sVar2 == 0) {
      is_abspath(path);
    }
    else if (sVar2 == 0xffffffffffffffff) {
      pcVar4 = ".";
      paVar3 = &local_12;
      goto LAB_00175ff3;
    }
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)path);
    bVar1 = is_root_path(__return_storage_ptr__);
    if (!bVar1) {
      std::__cxx11::string::pop_back();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string basedir(const string &path)
{
	if (path.empty())
		return "";

	if (is_root_path(path))
		return path;

	auto index = find_last_slash(path);
	if (index == string::npos)
		return ".";

	// Preserve the first slash.
	if (index == 0 && is_abspath(path))
		index++;

	auto ret = path.substr(0, index + 1);
	if (!is_root_path(ret))
		ret.pop_back();
	return ret;
}